

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_layer_t.h
# Opt level: O3

void __thiscall relu_layer_t::activate(relu_layer_t *this)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  int iVar3;
  int _x;
  int _y;
  int iVar4;
  
  iVar3 = (this->super_layer_t).in.size.x;
  if (0 < iVar3) {
    iVar4 = (this->super_layer_t).in.size.y;
    _x = 0;
    do {
      if (0 < iVar4) {
        iVar3 = (this->super_layer_t).in.size.z;
        _y = 0;
        do {
          if (0 < iVar3) {
            iVar4 = 0;
            do {
              pfVar2 = tensor_t<float>::get(&(this->super_layer_t).in,_x,_y,iVar4);
              auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)*pfVar2));
              pfVar2 = tensor_t<float>::get(&(this->super_layer_t).out,_x,_y,iVar4);
              *pfVar2 = auVar1._0_4_;
              iVar4 = iVar4 + 1;
              iVar3 = (this->super_layer_t).in.size.z;
            } while (iVar4 < iVar3);
            iVar4 = (this->super_layer_t).in.size.y;
          }
          _y = _y + 1;
        } while (_y < iVar4);
        iVar3 = (this->super_layer_t).in.size.x;
      }
      _x = _x + 1;
    } while (_x < iVar3);
  }
  return;
}

Assistant:

void activate() {
    for (int i = 0; i < in.size.x; i++)
      for (int j = 0; j < in.size.y; j++)
        for (int z = 0; z < in.size.z; z++) {
          float v = in(i, j, z);
          if (v < 0)
            v = 0;
          out(i, j, z) = v;
        }

  }